

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O3

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::get_all_timers(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                 *this,op_queue<asio::detail::scheduler_operation> *ops)

{
  wait_op *pwVar1;
  pointer phVar2;
  per_timer_data *ppVar3;
  scheduler_operation *psVar4;
  per_timer_data *ppVar5;
  
  ppVar3 = this->timers_;
  while (ppVar3 != (per_timer_data *)0x0) {
    ppVar5 = ppVar3->next_;
    this->timers_ = ppVar5;
    pwVar1 = (ppVar3->op_queue_).front_;
    if (pwVar1 != (wait_op *)0x0) {
      psVar4 = ops->back_;
      if (ops->back_ == (scheduler_operation *)0x0) {
        psVar4 = (scheduler_operation *)ops;
      }
      psVar4->next_ = &pwVar1->super_operation;
      ops->back_ = &((ppVar3->op_queue_).back_)->super_operation;
      (ppVar3->op_queue_).front_ = (wait_op *)0x0;
      (ppVar3->op_queue_).back_ = (wait_op *)0x0;
      ppVar5 = this->timers_;
    }
    ppVar3->next_ = (per_timer_data *)0x0;
    ppVar3->prev_ = (per_timer_data *)0x0;
    ppVar3 = ppVar5;
  }
  phVar2 = (this->heap_).
           super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->heap_).
      super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish != phVar2) {
    (this->heap_).
    super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = phVar2;
  }
  return;
}

Assistant:

virtual void get_all_timers(op_queue<operation>& ops)
  {
    while (timers_)
    {
      per_timer_data* timer = timers_;
      timers_ = timers_->next_;
      ops.push(timer->op_queue_);
      timer->next_ = 0;
      timer->prev_ = 0;
    }

    heap_.clear();
  }